

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.cpp
# Opt level: O2

void __thiscall Timer::~Timer(Timer *this)

{
  TimeEvent *this_00;
  _Base_ptr p_Var1;
  
  for (p_Var1 = (this->timers)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(this->timers)._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1)) {
    this_00 = *(TimeEvent **)(p_Var1 + 1);
    this_00->manager = (Timer *)0x0;
    TimeEvent::~TimeEvent(this_00);
    operator_delete(this_00,0x30);
  }
  std::
  _Rb_tree<TimeEvent_*,_TimeEvent_*,_std::_Identity<TimeEvent_*>,_std::less<TimeEvent_*>,_std::allocator<TimeEvent_*>_>
  ::clear(&(this->timers)._M_t);
  std::
  _Rb_tree<TimeEvent_*,_TimeEvent_*,_std::_Identity<TimeEvent_*>,_std::less<TimeEvent_*>,_std::allocator<TimeEvent_*>_>
  ::~_Rb_tree(&(this->execlist)._M_t);
  std::
  _Rb_tree<TimeEvent_*,_TimeEvent_*,_std::_Identity<TimeEvent_*>,_std::less<TimeEvent_*>,_std::allocator<TimeEvent_*>_>
  ::~_Rb_tree(&(this->timers)._M_t);
  std::unique_ptr<Timer::impl_t,_std::default_delete<Timer::impl_t>_>::~unique_ptr(&this->impl);
  return;
}

Assistant:

Timer::~Timer()
{
	UTIL_FOREACH(this->timers, timer)
	{
		timer->manager = 0;
		delete timer;
	}
	this->timers.clear();

#ifdef WIN32
	if (rres != 0)
	{
		timeEndPeriod(rres);
		rres = 0;
	}
#endif // WIN32
}